

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Holding.cpp
# Opt level: O2

void __thiscall Holding::PrintHolding(Holding *this)

{
  Holding *pHVar1;
  Holding *pHVar2;
  int iVar3;
  uint uVar4;
  ostream *poVar5;
  string *psVar6;
  ostream *poVar7;
  char *pcVar8;
  Holding **ppHVar9;
  Holding **ppHVar10;
  
  poVar5 = std::operator<<((ostream *)&std::cout,"Card: ");
  poVar5 = std::operator<<(poVar5,(string *)&this->name);
  std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<((ostream *)&std::cout,"Cost: ");
  iVar3 = (*(this->super_BlackCard).super_Card._vptr_Card[4])(this);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
  std::endl<char,std::char_traits<char>>(poVar5);
  std::operator<<((ostream *)&std::cout,"Holding Type: ");
  uVar4 = this->typeH - PLAIN;
  if (5 < uVar4) {
    return;
  }
  poVar7 = (ostream *)&std::cout;
  poVar5 = std::operator<<((ostream *)&std::cout,
                           &DAT_0010e884 + *(int *)(&DAT_0010e884 + (ulong)uVar4 * 4));
  std::endl<char,std::char_traits<char>>(poVar5);
  pcVar8 = "Tapped: no";
  if (this->tapped != false) {
    pcVar8 = "Tapped: yes";
  }
  poVar5 = std::operator<<((ostream *)&std::cout,pcVar8);
  std::endl<char,std::char_traits<char>>(poVar5);
  pcVar8 = "Revealed: no";
  if (this->revealed != false) {
    pcVar8 = "Revealed: yes";
  }
  poVar5 = std::operator<<((ostream *)&std::cout,pcVar8);
  std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<((ostream *)&std::cout,"Harvest Value: ");
  iVar3 = (*(this->super_BlackCard).super_Card._vptr_Card[7])(this);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
  std::endl<char,std::char_traits<char>>(poVar5);
  pHVar1 = this->upperHolding;
  pHVar2 = this->subHolding;
  if (pHVar1 == (Holding *)0x0 && pHVar2 == (Holding *)0x0) {
    poVar5 = std::operator<<((ostream *)&std::cout,"Holding is not in a chain");
    poVar7 = std::endl<char,std::char_traits<char>>(poVar5);
    goto LAB_0010a93f;
  }
  ppHVar10 = &this->subHolding;
  if (pHVar1 == (Holding *)0x0) {
    if (pHVar2->subHolding == (Holding *)0x0) {
      poVar5 = std::operator<<((ostream *)&std::cout,"Holding connected with the subHolding ");
    }
    else {
      poVar5 = std::operator<<((ostream *)&std::cout,"Holding in complete chain with ");
      psVar6 = BlackCard::getName_abi_cxx11_(&(*ppHVar10)->super_BlackCard);
      poVar5 = std::operator<<(poVar5,(string *)psVar6);
      poVar5 = std::operator<<(poVar5,"and ");
      ppHVar10 = &(*ppHVar10)->subHolding;
    }
  }
  else {
    ppHVar9 = &this->upperHolding;
    if (pHVar2 == (Holding *)0x0) {
      if (pHVar1->upperHolding != (Holding *)0x0) {
        poVar5 = std::operator<<((ostream *)&std::cout,"Holding in complete chain with ");
        psVar6 = BlackCard::getName_abi_cxx11_(&(*ppHVar9)->super_BlackCard);
        poVar5 = std::operator<<(poVar5,(string *)psVar6);
        poVar5 = std::operator<<(poVar5,"and ");
        ppHVar10 = &(*ppHVar9)->upperHolding;
        goto LAB_0010a924;
      }
      poVar5 = (ostream *)&std::cout;
      pcVar8 = "Holding connected with the upperholding ";
    }
    else {
      poVar5 = std::operator<<((ostream *)&std::cout,"Holding in complete chain with ");
      psVar6 = BlackCard::getName_abi_cxx11_(&(*ppHVar10)->super_BlackCard);
      poVar5 = std::operator<<(poVar5,(string *)psVar6);
      pcVar8 = "and ";
    }
    poVar5 = std::operator<<(poVar5,pcVar8);
    ppHVar10 = ppHVar9;
  }
LAB_0010a924:
  psVar6 = BlackCard::getName_abi_cxx11_(&(*ppHVar10)->super_BlackCard);
  poVar5 = std::operator<<(poVar5,(string *)psVar6);
  std::endl<char,std::char_traits<char>>(poVar5);
LAB_0010a93f:
  std::endl<char,std::char_traits<char>>(poVar7);
  return;
}

Assistant:

void Holding::PrintHolding()                  //prints holding's card stats
{
    cout << "Card: " << name << endl;
    cout << "Cost: " << getCost() << endl;

    cout << "Holding Type: ";
    if (typeH == PLAIN)
        cout << "Plain" << endl;
    else if (typeH == MINE)
        cout << "Mine" << endl;
    else if (typeH == GOLD_MINE)
        cout << "Gold Mine" << endl;
    else if (typeH == CRYSTAL_MINE)
        cout << "Crystal Mine" << endl;
    else if (typeH == FARMS)
        cout << "Farms" << endl;
    else if (typeH == SOLO)
        cout << "Gifts and Favour" << endl;
    else
        return;

    
    if (tapped)
        cout << "Tapped: yes" << endl;
    else
        cout << "Tapped: no" << endl;

    if (revealed)
        cout << "Revealed: yes" << endl;
    else
        cout << "Revealed: no" << endl;

    cout << "Harvest Value: " << getHarvestValue() << endl;

    if (!upperHolding && !subHolding)
    {
        cout << "Holding is not in a chain" << endl << endl;
        return;
    }
    if (upperHolding && subHolding)
        cout << "Holding in complete chain with "<< subHolding->getName() << "and " << upperHolding->getName() << endl;
    else if (upperHolding)
    {
        if (upperHolding->upperHolding)
            cout << "Holding in complete chain with "<< upperHolding->getName() << "and " << upperHolding->upperHolding->getName() << endl;
        else
            cout << "Holding connected with the upperholding " << upperHolding->getName() << endl;
    }
    else
    {
        if (subHolding->subHolding)
            cout << "Holding in complete chain with "<< subHolding->getName() << "and " << subHolding->subHolding->getName() << endl;
        else
            cout << "Holding connected with the subHolding " << subHolding->getName() << endl;
    }
    cout << endl;
}